

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

void __thiscall FRandom::FRandom(FRandom *this,char *name)

{
  FRandom *pFVar1;
  DWORD DVar2;
  size_t sVar3;
  FRandom **ppFVar4;
  
  sVar3 = strlen(name);
  DVar2 = CalcCRC32((BYTE *)name,(uint)sVar3);
  this->NameCRC = DVar2;
  this->initialized = false;
  this->Name = name;
  if (DVar2 == 0) {
    __assert_fail("NameCRC != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                  ,0xb2,"FRandom::FRandom(const char *)");
  }
  ppFVar4 = &RNGList;
  do {
    pFVar1 = *ppFVar4;
    if (pFVar1 == (FRandom *)0x0) {
LAB_0046e93b:
      this->Next = pFVar1;
      *ppFVar4 = this;
      return;
    }
    if (DVar2 <= pFVar1->NameCRC) {
      if (pFVar1->NameCRC == DVar2) {
        __assert_fail("probe->NameCRC != NameCRC",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                      ,0xc4,"FRandom::FRandom(const char *)");
      }
      goto LAB_0046e93b;
    }
    ppFVar4 = &pFVar1->Next;
  } while( true );
}

Assistant:

FRandom::FRandom (const char *name)
{
	NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));
#ifndef NDEBUG
	initialized = false;
	Name = name;
	// A CRC of 0 is reserved for nameless RNGs that don't get stored
	// in savegames. The chance is very low that you would get a CRC of 0,
	// but it's still possible.
	assert (NameCRC != 0);
#endif

	// Insert the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}

#ifndef NDEBUG
	if (probe != NULL)
	{
		// Because RNGs are identified by their CRCs in save games,
		// no two RNGs can have names that hash to the same CRC.
		// Obviously, this means every RNG must have a unique name.
		assert (probe->NameCRC != NameCRC);
	}
#endif

	Next = probe;
	*prev = this;
}